

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
         *this,size_t new_capacity)

{
  size_t capacity;
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  slot_type *__p;
  FindInfo FVar4;
  Layout LVar5;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_41;
  new_allocator<std::pair<std::__cxx11::string_const,cs::csym_info>> *local_40;
  ctrl_t *local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_38 = this->ctrl_;
    __p = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      local_40 = (new_allocator<std::pair<std::__cxx11::string_const,cs::csym_info>> *)
                 &this->settings_;
      sVar3 = 0;
      do {
        if (-1 < local_38[sVar3]) {
          sVar2 = std::
                  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(&local_41,&(__p->value).first);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = sVar2;
          sVar2 = SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                  SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0);
          FVar4 = find_first_non_full(this,sVar2);
          set_ctrl(this,FVar4.offset,(byte)sVar2 & 0x7f);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
                  *)&this->slots_[FVar4.offset].value,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
                  *)&__p->value);
          __gnu_cxx::new_allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>::
          destroy<std::pair<std::__cxx11::string,cs::csym_info>>
                    (local_40,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
                               *)&__p->value);
        }
        sVar3 = sVar3 + 1;
        __p = __p + 1;
      } while (capacity != sVar3);
      LVar5 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
                ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>
                  *)local_40,local_38,
                 LVar5.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_cs::csym_info>_>
                 .size_[1] * 0x70 +
                 (LVar5.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_cs::csym_info>_>
                  .size_[0] + 7 & 0xfffffffffffffff8));
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8dd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, cs::csym_info>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, cs::csym_info>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, cs::csym_info>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, cs::csym_info>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n)
		{
			return ((n + 1) & n) == 0 && n > 0;
		}